

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

gdImagePtr gdImageCreate(int sx,int sy)

{
  int iVar1;
  uchar **ppuVar2;
  uchar *puVar3;
  gdImagePtr im;
  int i;
  int sy_local;
  int sx_local;
  
  iVar1 = overflow2(sx,sy);
  if (iVar1 == 0) {
    iVar1 = overflow2(8,sy);
    if (iVar1 == 0) {
      iVar1 = overflow2(1,sx);
      if (iVar1 == 0) {
        _sy_local = (gdImagePtr)gdCalloc(1,0x1ca8);
        if (_sy_local == (gdImagePtr)0x0) {
          _sy_local = (gdImagePtr)0x0;
        }
        else {
          ppuVar2 = (uchar **)gdMalloc((long)sy << 3);
          _sy_local->pixels = ppuVar2;
          if (_sy_local->pixels == (uchar **)0x0) {
            gdFree(_sy_local);
            _sy_local = (gdImagePtr)0x0;
          }
          else {
            _sy_local->polyInts = (int *)0x0;
            _sy_local->polyAllocated = 0;
            _sy_local->brush = (gdImageStruct *)0x0;
            _sy_local->tile = (gdImageStruct *)0x0;
            _sy_local->style = (int *)0x0;
            for (im._4_4_ = 0; im._4_4_ < sy; im._4_4_ = im._4_4_ + 1) {
              puVar3 = (uchar *)gdCalloc((long)sx,1);
              _sy_local->pixels[im._4_4_] = puVar3;
              if (_sy_local->pixels[im._4_4_] == (uchar *)0x0) {
                while (im._4_4_ = im._4_4_ + -1, -1 < im._4_4_) {
                  gdFree(_sy_local->pixels[im._4_4_]);
                }
                gdFree(_sy_local->pixels);
                gdFree(_sy_local);
                return (gdImagePtr)0x0;
              }
            }
            _sy_local->sx = sx;
            _sy_local->sy = sy;
            _sy_local->colorsTotal = 0;
            _sy_local->transparent = -1;
            _sy_local->interlace = 0;
            _sy_local->thick = 1;
            _sy_local->AA = 0;
            for (im._4_4_ = 0; im._4_4_ < 0x100; im._4_4_ = im._4_4_ + 1) {
              _sy_local->open[im._4_4_] = 1;
            }
            _sy_local->trueColor = 0;
            _sy_local->tpixels = (int **)0x0;
            _sy_local->cx1 = 0;
            _sy_local->cy1 = 0;
            _sy_local->cx2 = _sy_local->sx + -1;
            _sy_local->cy2 = _sy_local->sy + -1;
            _sy_local->res_x = 0x60;
            _sy_local->res_y = 0x60;
            _sy_local->interpolation = (interpolation_method)0x0;
            _sy_local->interpolation_id = GD_BILINEAR_FIXED;
          }
        }
      }
      else {
        _sy_local = (gdImagePtr)0x0;
      }
    }
    else {
      _sy_local = (gdImagePtr)0x0;
    }
  }
  else {
    _sy_local = (gdImagePtr)0x0;
  }
  return _sy_local;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreate (int sx, int sy)
{
	int i;
	gdImagePtr im;

	if (overflow2(sx, sy)) {
		return NULL;
	}

	if (overflow2(sizeof (unsigned char *), sy)) {
		return NULL;
	}
	if (overflow2(sizeof (unsigned char), sx)) {
		return NULL;
	}

	im = (gdImage *) gdCalloc(1, sizeof(gdImage));
	if (!im) {
		return NULL;
	}

	/* Row-major ever since gd 1.3 */
	im->pixels = (unsigned char **) gdMalloc (sizeof (unsigned char *) * sy);
	if (!im->pixels) {
		gdFree(im);
		return NULL;
	}

	im->polyInts = 0;
	im->polyAllocated = 0;
	im->brush = 0;
	im->tile = 0;
	im->style = 0;
	for (i = 0; (i < sy); i++) {
		/* Row-major ever since gd 1.3 */
		im->pixels[i] = (unsigned char *) gdCalloc (sx, sizeof (unsigned char));
		if (!im->pixels[i]) {
			for (--i ; i >= 0; i--) {
				gdFree(im->pixels[i]);
			}
			gdFree(im->pixels);
			gdFree(im);
			return NULL;
		}

	}
	im->sx = sx;
	im->sy = sy;
	im->colorsTotal = 0;
	im->transparent = (-1);
	im->interlace = 0;
	im->thick = 1;
	im->AA = 0;
	for (i = 0; (i < gdMaxColors); i++) {
		im->open[i] = 1;
	};
	im->trueColor = 0;
	im->tpixels = 0;
	im->cx1 = 0;
	im->cy1 = 0;
	im->cx2 = im->sx - 1;
	im->cy2 = im->sy - 1;
	im->res_x = GD_RESOLUTION;
	im->res_y = GD_RESOLUTION;
	im->interpolation = NULL;
	im->interpolation_id = GD_BILINEAR_FIXED;
	return im;
}